

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t local_50;
  size_t n;
  undefined1 local_40 [4];
  int ret;
  mbedtls_mpi TB;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  TB.p = (mbedtls_mpi_uint *)B;
  iVar1 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar1 < 0) {
    return -10;
  }
  mbedtls_mpi_init((mbedtls_mpi *)local_40);
  if (X == (mbedtls_mpi *)TB.p) {
    n._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_40,(mbedtls_mpi *)TB.p);
    if (n._4_4_ != 0) goto LAB_00184918;
    TB.p = (mbedtls_mpi_uint *)local_40;
  }
  if ((X == A) || (n._4_4_ = mbedtls_mpi_copy(X,A), n._4_4_ == 0)) {
    X->s = 1;
    n._4_4_ = 0;
    local_50 = TB.p[1];
    while ((local_50 != 0 && (*(long *)(TB.p[2] + (local_50 - 1) * 8) == 0))) {
      local_50 = local_50 - 1;
    }
    mpi_sub_hlp(local_50,(mbedtls_mpi_uint *)TB.p[2],X->p);
  }
LAB_00184918:
  mbedtls_mpi_free((mbedtls_mpi *)local_40);
  return n._4_4_;
}

Assistant:

int mbedtls_mpi_sub_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    mbedtls_mpi TB;
    int ret;
    size_t n;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    mbedtls_mpi_init( &TB );

    if( X == B )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );
        B = &TB;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned subtractions.
     */
    X->s = 1;

    ret = 0;

    for( n = B->n; n > 0; n-- )
        if( B->p[n - 1] != 0 )
            break;

    mpi_sub_hlp( n, B->p, X->p );

cleanup:

    mbedtls_mpi_free( &TB );

    return( ret );
}